

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

float __thiscall TransferFunctionSRGB::decode(TransferFunctionSRGB *this,float brightness)

{
  float fVar1;
  float fVar2;
  
  if (0.04045 <= brightness) {
    fVar1 = powf((brightness + 0.055) * 0.94786733,2.4);
  }
  else {
    fVar1 = brightness * 0.07739938;
  }
  fVar2 = 1.0;
  if (fVar1 <= 1.0) {
    fVar2 = fVar1;
  }
  return (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar2);
}

Assistant:

float decode(const float brightness) const override {
        float intensity;

        if (brightness < .04045f)
            intensity = saturate(brightness * (1.0f/12.92f));
        else
            intensity = saturate(powf((brightness + .055f) * (1.0f/1.055f), 2.4f));

        return intensity;
    }